

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O1

void __thiscall QTriangulatingStroker::moveTo(QTriangulatingStroker *this,qreal *pts)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  QVarLengthArray<float,_256LL> points;
  QVarLengthArray<float,_256LL> local_448;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  dVar1 = *pts;
  dVar2 = pts[1];
  *(ulong *)(this + 0x18) = CONCAT44((float)dVar2,(float)dVar1);
  fVar10 = (float)pts[2] - (float)dVar1;
  fVar13 = (float)pts[3] - (float)dVar2;
  fVar12 = *(float *)(this + 0x28);
  fVar11 = hypotf(fVar10,fVar13);
  fVar13 = -fVar13 * (fVar12 / fVar11);
  *(float *)(this + 0x20) = fVar13;
  fVar10 = (fVar12 / fVar11) * fVar10;
  *(float *)(this + 0x24) = fVar10;
  lVar3 = *(long *)(this + 8);
  iVar4 = *(int *)(this + 100);
  if (iVar4 == 0x20) {
    memset(&local_448,0xaa,0x418);
    local_448.super_QVLABase<float>.super_QVLABaseBase.a = 0x100;
    local_448.super_QVLABase<float>.super_QVLABaseBase.s = 0;
    fVar12 = *(float *)(this + 0x18);
    fVar11 = *(float *)(this + 0x1c);
    local_448.super_QVLABase<float>.super_QVLABaseBase.ptr =
         &local_448.super_QVLAStorage<4UL,_4UL,_256LL>;
    arcPoints(this,fVar12,fVar11,fVar13 + fVar12,fVar10 + fVar11,fVar12 - fVar13,fVar11 - fVar10,
              &local_448);
    uVar9 = (ulong)((uint)(lVar3 != 0) * 2) + *(long *)(this + 8) +
            local_448.super_QVLABase<float>.super_QVLABaseBase.s;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,uVar9);
    *(ulong *)(this + 8) = uVar9;
    iVar4 = (int)(local_448.super_QVLABase<float>.super_QVLABaseBase.s / 2);
    if (iVar4 != 0) {
      uVar7 = (ulong)iVar4;
      iVar4 = (int)uVar9;
      lVar5 = *(long *)(this + 0x10) + (long)iVar4 * 4;
      lVar6 = 0;
      uVar8 = 0;
      uVar9 = uVar7;
      do {
        uVar9 = uVar9 - 1;
        *(undefined4 *)(lVar5 + -4 + lVar6 * 4) =
             *(undefined4 *)
              ((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr +
              lVar6 * 2 + uVar7 * 8 + -4);
        *(undefined4 *)(lVar5 + -8 + lVar6 * 4) =
             *(undefined4 *)
              ((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr +
              lVar6 * 2 + uVar7 * 8 + -8);
        if (uVar8 == (uVar9 & 0xffffffff)) {
          uVar9 = (ulong)((iVar4 + (int)lVar6) - 2);
          goto LAB_00443581;
        }
        *(undefined4 *)(lVar5 + -0xc + lVar6 * 4) =
             *(undefined4 *)
              ((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr + uVar8 * 8 + 4);
        *(undefined4 *)(lVar5 + -0x10 + lVar6 * 4) =
             *(undefined4 *)
              ((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr + uVar8 * 8);
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + -4;
      } while (uVar8 != (uVar9 & 0xffffffff));
      uVar9 = (ulong)(uint)(iVar4 + (int)lVar6);
    }
LAB_00443581:
    if (lVar3 != 0) {
      *(undefined8 *)(*(long *)(this + 0x10) + -8 + (long)(int)uVar9 * 4) =
           *(undefined8 *)(*(long *)(this + 0x10) + (long)(int)uVar9 * 4);
    }
    if ((QVLAStorage<4UL,_4UL,_256LL> *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr !=
        &local_448.super_QVLAStorage<4UL,_4UL,_256LL>) {
      QtPrivate::sizedFree
                (local_448.super_QVLABase<float>.super_QVLABaseBase.ptr,
                 local_448.super_QVLABase<float>.super_QVLABaseBase.a << 2);
    }
  }
  else {
    if (iVar4 == 0x10) {
      fVar10 = *(float *)(this + 0x18) - fVar10;
      fVar12 = *(float *)(this + 0x1c) + fVar13;
      if (lVar3 != 0) {
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 1);
        lVar3 = *(long *)(this + 8);
        *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar13 + fVar10;
        *(long *)(this + 8) = lVar3 + 1;
        fVar11 = *(float *)(this + 0x24);
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 2);
        lVar3 = *(long *)(this + 8);
        *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar11 + fVar12;
        *(long *)(this + 8) = lVar3 + 1;
      }
      fVar11 = *(float *)(this + 0x20);
      fVar13 = *(float *)(this + 0x24);
      QDataBuffer<float>::reserve((QDataBuffer<float> *)this,*(long *)(this + 8) + 1);
      lVar3 = *(long *)(this + 8);
      *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar10 + fVar11;
      *(long *)(this + 8) = lVar3 + 1;
      QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 2);
      lVar3 = *(long *)(this + 8);
      *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar12 + fVar13;
      *(long *)(this + 8) = lVar3 + 1;
      QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 2);
      lVar3 = *(long *)(this + 8);
      *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar10 - fVar11;
      *(long *)(this + 8) = lVar3 + 1;
      fVar12 = fVar12 - fVar13;
      QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 2);
      lVar3 = *(long *)(this + 8);
      lVar5 = *(long *)(this + 0x10);
    }
    else {
      if ((iVar4 != 0) || (lVar3 == 0)) goto LAB_004435b0;
      fVar12 = *(float *)(this + 0x18);
      QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 1);
      lVar3 = *(long *)(this + 8);
      *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar13 + fVar12;
      *(long *)(this + 8) = lVar3 + 1;
      fVar12 = *(float *)(this + 0x1c) + *(float *)(this + 0x24);
      QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 2);
      lVar3 = *(long *)(this + 8);
      lVar5 = *(long *)(this + 0x10);
    }
    *(float *)(lVar5 + lVar3 * 4) = fVar12;
    *(long *)(this + 8) = lVar3 + 1;
  }
LAB_004435b0:
  fVar12 = *(float *)(this + 0x18);
  fVar10 = *(float *)(this + 0x1c);
  fVar11 = *(float *)(this + 0x20);
  fVar13 = *(float *)(this + 0x24);
  QDataBuffer<float>::reserve((QDataBuffer<float> *)this,*(long *)(this + 8) + 1);
  lVar3 = *(long *)(this + 8);
  *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar12 + fVar11;
  *(long *)(this + 8) = lVar3 + 1;
  QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 2);
  lVar3 = *(long *)(this + 8);
  *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar10 + fVar13;
  *(long *)(this + 8) = lVar3 + 1;
  QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 2);
  lVar3 = *(long *)(this + 8);
  *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar12 - fVar11;
  *(long *)(this + 8) = lVar3 + 1;
  QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar3 + 2);
  lVar3 = *(long *)(this + 8);
  *(float *)(*(long *)(this + 0x10) + lVar3 * 4) = fVar10 - fVar13;
  *(long *)(this + 8) = lVar3 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTriangulatingStroker::moveTo(const qreal *pts)
{
    m_cx = pts[0];
    m_cy = pts[1];

    float x2 = pts[2];
    float y2 = pts[3];
    normalVector(m_cx, m_cy, x2, y2, &m_nvx, &m_nvy);


    // To achieve jumps we insert zero-area tringles. This is done by
    // adding two identical points in both the end of previous strip
    // and beginning of next strip
    bool invisibleJump = m_vertices.size();

    switch (m_cap_style) {
    case Qt::FlatCap:
        if (invisibleJump) {
            m_vertices.add(m_cx + m_nvx);
            m_vertices.add(m_cy + m_nvy);
        }
        break;
    case Qt::SquareCap: {
        float sx = m_cx - m_nvy;
        float sy = m_cy + m_nvx;
        if (invisibleJump) {
            m_vertices.add(sx + m_nvx);
            m_vertices.add(sy + m_nvy);
        }
        emitLineSegment(sx, sy, m_nvx, m_nvy);
        break; }
    case Qt::RoundCap: {
        QVarLengthArray<float> points;
        arcPoints(m_cx, m_cy, m_cx + m_nvx, m_cy + m_nvy, m_cx - m_nvx, m_cy - m_nvy, points);
        m_vertices.resize(m_vertices.size() + points.size() + 2 * int(invisibleJump));
        int count = m_vertices.size();
        int front = 0;
        int end = points.size() / 2;
        while (front != end) {
            m_vertices.at(--count) = points[2 * end - 1];
            m_vertices.at(--count) = points[2 * end - 2];
            --end;
            if (front == end)
                break;
            m_vertices.at(--count) = points[2 * front + 1];
            m_vertices.at(--count) = points[2 * front + 0];
            ++front;
        }

        if (invisibleJump) {
            m_vertices.at(count - 1) = m_vertices.at(count + 1);
            m_vertices.at(count - 2) = m_vertices.at(count + 0);
        }
        break; }
    default: break; // ssssh gcc...
    }
    emitLineSegment(m_cx, m_cy, m_nvx, m_nvy);
}